

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O0

void __thiscall
icu_63::RBBITableBuilder::buildSafeReverseTable(RBBITableBuilder *this,UErrorCode *status)

{
  bool bVar1;
  char16_t cVar2;
  char16_t cVar3;
  int32_t iVar4;
  int32_t iVar5;
  int32_t iVar6;
  void *pvVar7;
  UVector *pUVar8;
  UnicodeString *pUVar9;
  UnicodeString *this_00;
  UnicodeString *local_158;
  UVector *local_148;
  int local_100 [2];
  IntPair local_f8;
  IntPair states;
  UnicodeString *rowState_1;
  int32_t c2_1;
  int32_t c1_1;
  int32_t pairIdx;
  UnicodeString *rowState;
  int32_t row_1;
  int32_t charClass;
  UnicodeString *startState;
  int local_b0;
  int32_t row;
  RBBIStateDescriptor *s2StateD;
  int32_t s2;
  RBBIStateDescriptor *startStateD;
  int32_t local_80;
  int32_t startState_1;
  int32_t endState;
  int32_t wantedEndState;
  int32_t c2;
  int32_t c1;
  int32_t numStates;
  undefined1 local_58 [4];
  int32_t numCharClasses;
  UnicodeString safePairs;
  UErrorCode *status_local;
  RBBITableBuilder *this_local;
  
  safePairs.fUnion._48_8_ = status;
  UnicodeString::UnicodeString((UnicodeString *)local_58);
  iVar4 = RBBISetBuilder::getNumCharCategories(this->fRB->fSetBuilder);
  iVar5 = UVector::size(this->fDStates);
  wantedEndState = 0;
  do {
    if (iVar4 <= wantedEndState) {
      pUVar8 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)status);
      local_148 = (UVector *)0x0;
      local_158 = (UnicodeString *)status;
      if (pUVar8 != (UVector *)0x0) {
        local_158 = (UnicodeString *)uprv_deleteUObject_63;
        UVector::UVector(pUVar8,uprv_deleteUObject_63,uhash_compareUnicodeString_63,iVar4 + 2,
                         (UErrorCode *)safePairs.fUnion._48_8_);
        local_148 = pUVar8;
      }
      this->fSafeTable = local_148;
      for (local_b0 = 0; local_b0 < iVar4 + 2; local_b0 = local_b0 + 1) {
        pUVar8 = this->fSafeTable;
        pUVar9 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,(size_t)local_158);
        local_158 = (UnicodeString *)0x0;
        if (pUVar9 != (UnicodeString *)0x0) {
          UnicodeString::UnicodeString(pUVar9,iVar4,0,iVar4 + 4);
          local_158 = pUVar9;
        }
        UVector::addElement(pUVar8,local_158,(UErrorCode *)safePairs.fUnion._48_8_);
      }
      pUVar9 = (UnicodeString *)UVector::elementAt(this->fSafeTable,1);
      for (rowState._4_4_ = 0; rowState._4_4_ < iVar4; rowState._4_4_ = rowState._4_4_ + 1) {
        UnicodeString::setCharAt(pUVar9,rowState._4_4_,(short)rowState._4_4_ + L'\x02');
      }
      for (rowState._0_4_ = 2; (int)rowState < iVar4 + 2; rowState._0_4_ = (int)rowState + 1) {
        this_00 = (UnicodeString *)UVector::elementAt(this->fSafeTable,(int)rowState);
        UnicodeString::operator=(this_00,pUVar9);
      }
      for (c2_1 = 0; iVar4 = UnicodeString::length((UnicodeString *)local_58), c2_1 < iVar4;
          c2_1 = c2_1 + 2) {
        cVar2 = UnicodeString::charAt((UnicodeString *)local_58,c2_1);
        cVar3 = UnicodeString::charAt((UnicodeString *)local_58,c2_1 + 1);
        states = (IntPair)UVector::elementAt(this->fSafeTable,(ushort)cVar3 + 2);
        UnicodeString::setCharAt((UnicodeString *)states,(uint)(ushort)cVar2,L'\0');
      }
      local_100[1] = 1;
      local_100[0] = 0;
      std::pair<int,_int>::pair<int,_int,_true>(&local_f8,local_100 + 1,local_100);
      while (bVar1 = findDuplicateSafeState(this,&local_f8), bVar1) {
        removeSafeState(this,local_f8);
      }
      UnicodeString::~UnicodeString((UnicodeString *)local_58);
      return;
    }
    for (endState = 0; endState < iVar4; endState = endState + 1) {
      startState_1 = -1;
      local_80 = 0;
      for (startStateD._4_4_ = 1; startStateD._4_4_ < iVar5;
          startStateD._4_4_ = startStateD._4_4_ + 1) {
        pvVar7 = UVector::elementAt(this->fDStates,startStateD._4_4_);
        iVar6 = UVector32::elementAti(*(UVector32 **)((long)pvVar7 + 0x28),wantedEndState);
        pvVar7 = UVector::elementAt(this->fDStates,iVar6);
        status = (UErrorCode *)(ulong)(uint)endState;
        local_80 = UVector32::elementAti(*(UVector32 **)((long)pvVar7 + 0x28),endState);
        iVar6 = local_80;
        if ((-1 < startState_1) && (iVar6 = startState_1, startState_1 != local_80)) break;
        startState_1 = iVar6;
      }
      if (startState_1 == local_80) {
        UnicodeString::append((UnicodeString *)local_58,(char16_t)wantedEndState);
        status = (UErrorCode *)(ulong)(ushort)(char16_t)endState;
        UnicodeString::append((UnicodeString *)local_58,(char16_t)endState);
      }
    }
    wantedEndState = wantedEndState + 1;
  } while( true );
}

Assistant:

void RBBITableBuilder::buildSafeReverseTable(UErrorCode &status) {
    // The safe table creation has three steps:

    // 1. Identifiy pairs of character classes that are "safe." Safe means that boundaries
    // following the pair do not depend on context or state before the pair. To test
    // whether a pair is safe, run it through the main forward state table, starting
    // from each state. If the the final state is the same, no matter what the starting state,
    // the pair is safe.
    //
    // 2. Build a state table that recognizes the safe pairs. It's similar to their
    // forward table, with a column for each input character [class], and a row for
    // each state. Row 1 is the start state, and row 0 is the stop state. Initially
    // create an additional state for each input character category; being in
    // one of these states means that the character has been seen, and is potentially
    // the first of a pair. In each of these rows, the entry for the second character
    // of a safe pair is set to the stop state (0), indicating that a match was found.
    // All other table entries are set to the state corresponding the current input
    // character, allowing that charcter to be the of a start following pair.
    //
    // Because the safe rules are to be run in reverse, moving backwards in the text,
    // the first and second pair categories are swapped when building the table.
    //
    // 3. Compress the table. There are typically many rows (states) that are
    // equivalent - that have zeroes (match completed) in the same columns -
    // and can be folded together.

    // Each safe pair is stored as two UChars in the safePair string.
    UnicodeString safePairs;

    int32_t numCharClasses = fRB->fSetBuilder->getNumCharCategories();
    int32_t numStates = fDStates->size();

    for (int32_t c1=0; c1<numCharClasses; ++c1) {
        for (int32_t c2=0; c2 < numCharClasses; ++c2) {
            int32_t wantedEndState = -1;
            int32_t endState = 0;
            for (int32_t startState = 1; startState < numStates; ++startState) {
                RBBIStateDescriptor *startStateD = static_cast<RBBIStateDescriptor *>(fDStates->elementAt(startState));
                int32_t s2 = startStateD->fDtran->elementAti(c1);
                RBBIStateDescriptor *s2StateD = static_cast<RBBIStateDescriptor *>(fDStates->elementAt(s2));
                endState = s2StateD->fDtran->elementAti(c2);
                if (wantedEndState < 0) {
                    wantedEndState = endState;
                } else {
                    if (wantedEndState != endState) {
                        break;
                    }
                }
            }
            if (wantedEndState == endState) {
                safePairs.append((char16_t)c1);
                safePairs.append((char16_t)c2);
                // printf("(%d, %d) ", c1, c2);
            }
        }
        // printf("\n");
    }

    // Populate the initial safe table.
    // The table as a whole is UVector<UnicodeString>
    // Each row is represented by a UnicodeString, being used as a Vector<int16>.
    // Row 0 is the stop state.
    // Row 1 is the start sate.
    // Row 2 and beyond are other states, initially one per char class, but
    //   after initial construction, many of the states will be combined, compacting the table.
    // The String holds the nextState data only. The four leading fields of a row, fAccepting,
    // fLookAhead, etc. are not needed for the safe table, and are omitted at this stage of building.

    U_ASSERT(fSafeTable == nullptr);
    fSafeTable = new UVector(uprv_deleteUObject, uhash_compareUnicodeString, numCharClasses + 2, status);
    for (int32_t row=0; row<numCharClasses + 2; ++row) {
        fSafeTable->addElement(new UnicodeString(numCharClasses, 0, numCharClasses+4), status);
    }

    // From the start state, each input char class transitions to the state for that input.
    UnicodeString &startState = *static_cast<UnicodeString *>(fSafeTable->elementAt(1));
    for (int32_t charClass=0; charClass < numCharClasses; ++charClass) {
        // Note: +2 for the start & stop state.
        startState.setCharAt(charClass, static_cast<char16_t>(charClass+2));
    }

    // Initially make every other state table row look like the start state row,
    for (int32_t row=2; row<numCharClasses+2; ++row) {
        UnicodeString &rowState = *static_cast<UnicodeString *>(fSafeTable->elementAt(row));
        rowState = startState;   // UnicodeString assignment, copies contents.
    }

    // Run through the safe pairs, set the next state to zero when pair has been seen.
    // Zero being the stop state, meaning we found a safe point.
    for (int32_t pairIdx=0; pairIdx<safePairs.length(); pairIdx+=2) {
        int32_t c1 = safePairs.charAt(pairIdx);
        int32_t c2 = safePairs.charAt(pairIdx + 1);

        UnicodeString &rowState = *static_cast<UnicodeString *>(fSafeTable->elementAt(c2 + 2));
        rowState.setCharAt(c1, 0);
    }

    // Remove duplicate or redundant rows from the table.
    IntPair states = {1, 0};
    while (findDuplicateSafeState(&states)) {
        // printf("Removing duplicate safe states (%d, %d)\n", states.first, states.second);
        removeSafeState(states);
    }
}